

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O2

void __thiscall groundupdbext::FileKeyValueStore::clear(FileKeyValueStore *this)

{
  bool bVar1;
  path local_40;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_40,
             &((this->mImpl)._M_t.
               super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
               .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl)
              ->m_fullpath,auto_format);
  bVar1 = std::filesystem::exists(&local_40);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_40);
  if (bVar1) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_40,
               &((this->mImpl)._M_t.
                 super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                 .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>.
                _M_head_impl)->m_fullpath,auto_format);
    std::filesystem::remove_all((path *)&local_40);
    Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_40);
  }
  return;
}

Assistant:

void
FileKeyValueStore::clear()
{
  if (fs::exists(mImpl->m_fullpath)) {
      fs::remove_all(mImpl->m_fullpath);
  }
}